

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dl.c
# Opt level: O0

void uv_dlclose(uv_lib_t *lib)

{
  long *in_RDI;
  
  if (in_RDI[1] != 0) {
    free((void *)in_RDI[1]);
    in_RDI[1] = 0;
  }
  if (*in_RDI != 0) {
    dlclose(*in_RDI);
    *in_RDI = 0;
  }
  return;
}

Assistant:

void uv_dlclose(uv_lib_t* lib) {
  if (lib->errmsg) {
    free(lib->errmsg);
    lib->errmsg = NULL;
  }

  if (lib->handle) {
    /* Ignore errors. No good way to signal them without leaking memory. */
    dlclose(lib->handle);
    lib->handle = NULL;
  }
}